

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SizePolicy.cpp
# Opt level: O2

uint PrimePolicy::GetPrime(uint min,int *modFunctionIndex)

{
  bool bVar1;
  int i;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  uint candidate;
  
  if (min == 0) {
    uVar4 = 0x11;
    lVar2 = 3;
LAB_0021c903:
    *modFunctionIndex = (int)lVar2;
  }
  else {
    puVar3 = primes;
    for (lVar2 = 0; lVar2 != 0x4b; lVar2 = lVar2 + 1) {
      uVar4 = *puVar3;
      if (min <= uVar4) goto LAB_0021c903;
      puVar3 = puVar3 + 1;
    }
    *modFunctionIndex = 0x4b;
    candidate = min | 1;
    while ((uVar4 = min, candidate < 0x7fffffff &&
           (bVar1 = IsPrime(candidate), uVar4 = candidate, !bVar1))) {
      candidate = candidate + 2;
    }
  }
  return uVar4;
}

Assistant:

uint
PrimePolicy::GetPrime(uint min, int *modFunctionIndex)
{
    if (min <= 0)
    {
        *modFunctionIndex = 3;
        AssertMsg(primes[3] == 17, "Update modFunctionIndex for 17");
        return 17;
    }

    for (int i = 0; i < sizeof(primes)/sizeof(uint); i++)
    {
        uint prime = primes[i];
        if (prime >= min)
        {
            *modFunctionIndex = i;
            return prime;
        }
    }

    *modFunctionIndex = UNKNOWN_MOD_INDEX;
    //outside of our predefined table.
    //compute the hard way.
    for (uint i = (min | 1); i < 0x7FFFFFFF; i += 2)
    {
        if (IsPrime(i))
        {
            return i;
        }
    }
    return min;
}